

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

void __thiscall SignatureData::MergeSignatureData(SignatureData *this,SignatureData *sigdata)

{
  long lVar1;
  bool bVar2;
  move_iterator<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  __first;
  SignatureData *in_RSI;
  move_iterator<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  in_RDI;
  long in_FS_OFFSET;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffa8;
  SignatureData *in_stack_ffffffffffffffb0;
  _Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __i;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((_Base_ptr)in_RDI._M_current._M_node)->_M_color & _S_black) == _S_red) {
    if ((in_RSI->complete & 1U) == 0) {
      bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty(in_stack_ffffffffffffffa8);
      if ((bVar2) &&
         (bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty(in_stack_ffffffffffffffa8)
         , !bVar2)) {
        CScript::operator=((CScript *)in_RSI,(CScript *)in_stack_ffffffffffffffb0);
      }
      bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty(in_stack_ffffffffffffffa8);
      if ((bVar2) &&
         (bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty(in_stack_ffffffffffffffa8)
         , !bVar2)) {
        CScript::operator=((CScript *)in_RSI,(CScript *)in_stack_ffffffffffffffb0);
      }
      __i = in_RDI._M_current._M_node + 0x160;
      std::
      map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::begin((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
               *)__i._M_node);
      std::
      make_move_iterator<std::_Rb_tree_iterator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                (__i);
      __first._M_current._M_node =
           std::
           map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
           ::end((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                  *)__i._M_node);
      std::
      make_move_iterator<std::_Rb_tree_iterator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                (__i);
      std::
      map<CKeyID,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
      ::
      insert<std::move_iterator<std::_Rb_tree_iterator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
                ((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                  *)in_stack_ffffffffffffffa8,__first,in_RDI);
    }
    else {
      operator=(in_RSI,in_stack_ffffffffffffffb0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SignatureData::MergeSignatureData(SignatureData sigdata)
{
    if (complete) return;
    if (sigdata.complete) {
        *this = std::move(sigdata);
        return;
    }
    if (redeem_script.empty() && !sigdata.redeem_script.empty()) {
        redeem_script = sigdata.redeem_script;
    }
    if (witness_script.empty() && !sigdata.witness_script.empty()) {
        witness_script = sigdata.witness_script;
    }
    signatures.insert(std::make_move_iterator(sigdata.signatures.begin()), std::make_move_iterator(sigdata.signatures.end()));
}